

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_socket.cpp
# Opt level: O2

void __thiscall
booster::aio::anon_unknown_15::reader_all::operator()(reader_all *this,error_code *e)

{
  stream_socket *this_00;
  bool bVar1;
  size_t n;
  error_code err;
  callback<void_(const_std::error_code_&)> cStack_38;
  intrusive_ptr<booster::aio::(anonymous_namespace)::reader_all> local_30;
  error_code local_28;
  
  if (e->_M_value != 0) {
    callback<void_(const_std::error_code_&,_unsigned_long)>::operator()(&this->h,e,this->count);
    return;
  }
  local_28._M_value = 0;
  local_28._M_cat = (error_category *)std::_V2::system_category();
  n = stream_socket::read_some(this->self,&this->buf,&local_28);
  this->count = this->count + n;
  operator+=(&this->buf,n);
  if ((this->buf).super_buffer_impl<char_*>.size_ == 0) {
LAB_00179bf9:
    callback<void_(const_std::error_code_&,_unsigned_long)>::operator()
              (&this->h,&local_28,this->count);
  }
  else {
    if (local_28._M_value != 0) {
      bVar1 = basic_io_device::would_block(&local_28);
      if (!bVar1) goto LAB_00179bf9;
    }
    this_00 = this->self;
    local_30.p_ = this;
    atomic_counter::inc(&(this->super_callable<void_(const_std::error_code_&)>).super_refcounted.
                         refs_);
    callback<void_(const_std::error_code_&)>::
    callback<booster::aio::(anonymous_namespace)::reader_all>(&cStack_38,&local_30);
    basic_io_device::on_readable((basic_io_device *)this_00,&cStack_38);
    intrusive_ptr<booster::callable<void_(const_std::error_code_&)>_>::~intrusive_ptr
              (&cStack_38.call_ptr);
    intrusive_ptr<booster::aio::(anonymous_namespace)::reader_all>::~intrusive_ptr(&local_30);
  }
  return;
}

Assistant:

void operator()(system::error_code const &e)
		{
			if(e) {
				h(e,count);
			}
			else {
				system::error_code err;
				size_t n=self->read_some(buf,err);
				count+=n;
				buf+=n;
				if(buf.empty() || (err && !basic_io_device::would_block(err))) {
					h(err,count);
				}
				else {
					self->on_readable(intrusive_ptr<reader_all>(this));
				}
			}
		}